

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_3,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Vector<float,_3> local_70;
  tcu local_60 [8];
  Type in1;
  Vector<float,_3> local_40;
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_70.m_data[2] = (evalCtx->coords).m_data[2];
    local_70.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_3>::Vector(&local_70,(Vector<float,_3> *)s_constInVec3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,6>(&in1,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)&DAT_00000001,in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&in1,(float *)(s_constInMat2x3 + 0x18));
  }
  tcu::operator*(local_60,&local_70,&in1);
  local_40.m_data._0_8_ = local_60;
  local_40.m_data[2] = local_60._0_4_;
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_40);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}